

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::SimpleEvaluate(FParser *this,svalue_t *returnvar,int n)

{
  tokentype_t tVar1;
  int iVar2;
  char *pcVar3;
  DFsVariable *this_00;
  long lVar4;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int *piVar5;
  char *pcVar6;
  double dVar7;
  
  tVar1 = this->TokenType[n];
  if (tVar1 != name_) {
    if (tVar1 == number) {
      pcVar6 = this->Tokens[n];
      pcVar3 = strchr(pcVar6,0x2e);
      if (pcVar3 == (char *)0x0) {
        returnvar->type = 1;
        iVar2 = atoi(pcVar6);
        (returnvar->value).i = iVar2;
      }
      else {
        dVar7 = atof(pcVar6);
        (returnvar->value).i = (int)(dVar7 * 65536.0);
        returnvar->type = 6;
      }
    }
    else if (tVar1 == string_) {
      returnvar->type = 0;
      FString::operator=(&returnvar->string,this->Tokens[n]);
      return;
    }
    return;
  }
  this_00 = DFsScript::FindVariable(this->Script,this->Tokens[n]);
  if (this_00 == (DFsVariable *)0x0) {
    piVar5 = (int *)this->Tokens[n];
    pcVar6 = "unknown variable \'%s\'\n";
    script_error("unknown variable \'%s\'\n");
    do {
      lVar4 = (long)*piVar5;
      if ((**(char **)(pcVar6 + lVar4 * 8 + 0x10) != '(') ||
         (**(char **)(pcVar6 + (long)*(int *)CONCAT44(extraout_var,extraout_EDX) * 8 + 0x10) != ')')
         ) {
        return;
      }
      iVar2 = 0;
      for (; lVar4 < *(int *)CONCAT44(extraout_var,extraout_EDX); lVar4 = lVar4 + 1) {
        if ((*(int *)(pcVar6 + lVar4 * 4 + 0x810) == 2) &&
           (iVar2 = (iVar2 + (uint)(**(char **)(pcVar6 + lVar4 * 8 + 0x10) == '(')) -
                    (uint)(**(char **)(pcVar6 + lVar4 * 8 + 0x10) == ')'), iVar2 == 0)) {
          return;
        }
      }
      *piVar5 = *piVar5 + 1;
      *(int *)CONCAT44(extraout_var,extraout_EDX) = *(int *)CONCAT44(extraout_var,extraout_EDX) + -1
      ;
    } while( true );
  }
  DFsVariable::GetValue(this_00,returnvar);
  return;
}

Assistant:

void FParser::SimpleEvaluate(svalue_t &returnvar, int n)
{
	DFsVariable *var;
	
	switch(TokenType[n])
    {
    case string_: 
		returnvar.type = svt_string;
		returnvar.string = Tokens[n];
		break;
		
    case number:
		if(strchr(Tokens[n], '.'))
		{
			returnvar.setDouble(atof(Tokens[n]));
		}
		else
		{
			returnvar.type = svt_int;
			returnvar.value.i = atoi(Tokens[n]);
		}
		break;
		
    case name_:   
		var = Script->FindVariable(Tokens[n]);
		if(!var)
		{
			script_error("unknown variable '%s'\n", Tokens[n]);
		}
		else var->GetValue(returnvar);
		
    default: 
		break;
    }
}